

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O0

value_type *
(anonymous_namespace)::serialize_and_visit<(anonymous_namespace)::ToString,test::LargeEnumClass>
          (LargeEnumClass *in)

{
  value_type *in_RDI;
  string_view sVar1;
  cx_string<100UL> tag;
  InputStream istream;
  ToString visitor;
  OutputStream ostream;
  stringstream stream;
  OutputStream *in_stack_fffffffffffffc28;
  LargeEnumClass *in_stack_fffffffffffffc30;
  string_view in_stack_fffffffffffffc58;
  long local_198 [51];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::ios::exceptions((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  mserialize::serialize<test::LargeEnumClass,OutputStream>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  anon_unknown.dwarf_ae198::ToString::ToString((ToString *)in_RDI);
  mserialize::tag<test::LargeEnumClass>();
  sVar1 = mserialize::cx_string::operator_cast_to_string_view((cx_string<100UL> *)0x1a82ed);
  mserialize::visit<(anonymous_namespace)::ToString,InputStream>
            (in_stack_fffffffffffffc58,(ToString *)sVar1._len,(InputStream *)sVar1._ptr);
  ToString::value_abi_cxx11_((ToString *)sVar1._len);
  anon_unknown.dwarf_ae198::ToString::~ToString((ToString *)0x1a834d);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return in_RDI;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}